

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O2

Bend * __thiscall
OpenMD::MoleculeCreator::createBend
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,BendStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  pointer ppAVar1;
  Atom *pAVar2;
  _Alloc_hider _Var3;
  int iVar4;
  BendType *bt;
  Bend *this_00;
  DirectionalAtom *ghostAtom;
  uint uVar5;
  Atom *pAVar6;
  string s;
  allocator<char> local_15b;
  allocator<char> local_15a;
  allocator<char> local_159;
  string local_158;
  string local_138;
  Atom *local_118;
  string local_110;
  char *local_f0;
  vector<int,_std::allocator<int>_> bendAtoms;
  _Vector_base<double,_std::allocator<double>_> local_d0;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  char *local_a0 [4];
  string local_80;
  BendTypeParser btParser;
  
  BendTypeParser::BendTypeParser(&btParser);
  std::vector<int,_std::allocator<int>_>::vector(&bendAtoms,&stamp->members_);
  pAVar6 = (Atom *)((long)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2);
  if (pAVar6 == (Atom *)0x2) {
    if ((stamp->GhostVectorSource).super_ParameterBase.empty_ == false) {
      uVar5 = *(uint *)&(stamp->GhostVectorSource).super_ParameterBase.field_0x2c;
      ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pAVar2 = ppAVar1[(uint)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start
                             [uVar5 == *bendAtoms.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start]];
      pAVar6 = ppAVar1[uVar5];
      if (pAVar6 == (Atom *)0x0) {
LAB_0016a8a3:
        builtin_strncpy(painCave.errMsg,"Can not cast Atom to DirectionalAtom",0x25);
        painCave.isFatal = 1;
        simError();
        ghostAtom = (DirectionalAtom *)0x0;
      }
      else {
        ghostAtom = (DirectionalAtom *)
                    __dynamic_cast(pAVar6,&Atom::typeinfo,&DirectionalAtom::typeinfo,0);
        if (ghostAtom == (DirectionalAtom *)0x0) goto LAB_0016a8a3;
      }
      if (stamp->hasOverride_ == true) {
        std::__cxx11::string::string((string *)&s,(string *)&stamp->orType_);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_d0,&stamp->orPars_);
        pAVar6 = (Atom *)BendTypeParser::parseTypeAndPars
                                   (&btParser,&s,
                                    (vector<double,_std::allocator<double>_> *)&local_d0);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d0);
        std::__cxx11::string::~string((string *)&s);
      }
      else {
        (*(pAVar2->super_StuntDouble)._vptr_StuntDouble[7])(&s,pAVar2);
        (*(ghostAtom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(&local_158,ghostAtom);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"GHOST",(allocator<char> *)&local_110);
        pAVar6 = (Atom *)ForceField::getBendType(ff,&s,&local_158,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&s);
        if (pAVar6 == (Atom *)0x0) {
          (*(pAVar2->super_StuntDouble)._vptr_StuntDouble[7])(&s,pAVar2);
          _Var3 = s._M_dataplus;
          (*(ghostAtom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(&local_158,ghostAtom);
          pAVar6 = (Atom *)0x0;
          snprintf(painCave.errMsg,2000,"Can not find Matching Bend Type for[%s, %s, %s]",_Var3._M_p
                   ,local_158._M_dataplus._M_p,"GHOST");
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&s);
          painCave.isFatal = 1;
          simError();
        }
      }
      this_00 = (Bend *)operator_new(0x98);
      GhostBend::GhostBend((GhostBend *)this_00,pAVar2,ghostAtom,(BendType *)pAVar6);
      goto LAB_0016aa57;
    }
  }
  else if (pAVar6 == (Atom *)0x3) {
    ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_118 = ppAVar1[(uint)*bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start];
    pAVar2 = ppAVar1[(uint)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[1]];
    pAVar6 = ppAVar1[(uint)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[2]];
    if (stamp->hasOverride_ == true) {
      std::__cxx11::string::string((string *)&s,(string *)&stamp->orType_);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_b8,&stamp->orPars_);
      bt = BendTypeParser::parseTypeAndPars
                     (&btParser,&s,(vector<double,_std::allocator<double>_> *)&local_b8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
      std::__cxx11::string::~string((string *)&s);
    }
    else {
      (*(local_118->super_StuntDouble)._vptr_StuntDouble[7])(&local_158);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,local_158._M_dataplus._M_p,&local_159);
      (*(pAVar2->super_StuntDouble)._vptr_StuntDouble[7])(&local_110,pAVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,local_110._M_dataplus._M_p,&local_15a);
      (*(pAVar6->super_StuntDouble)._vptr_StuntDouble[7])(local_a0,pAVar6);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,local_a0[0],&local_15b)
      ;
      bt = ForceField::getBendType(ff,&s,&local_138,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::~string((string *)&local_158);
      if (bt == (BendType *)0x0) {
        (*(local_118->super_StuntDouble)._vptr_StuntDouble[7])(&s);
        _Var3 = s._M_dataplus;
        (*(pAVar2->super_StuntDouble)._vptr_StuntDouble[7])(&local_158,pAVar2);
        local_f0 = local_158._M_dataplus._M_p;
        (*(pAVar6->super_StuntDouble)._vptr_StuntDouble[7])(&local_138,pAVar6);
        bt = (BendType *)0x0;
        snprintf(painCave.errMsg,2000,"Can not find Matching Bend Type for[%s, %s, %s]",_Var3._M_p,
                 local_f0,local_138._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&s);
        painCave.isFatal = 1;
        simError();
      }
    }
    this_00 = (Bend *)operator_new(0x98);
    Bend::Bend(this_00,local_118,pAVar2,pAVar6,bt);
    goto LAB_0016aa57;
  }
  this_00 = (Bend *)0x0;
LAB_0016aa57:
  uVar5 = (uint)pAVar6;
  iVar4 = IndexListContainer::pop(&localIndexMan->bendIndexContainer_);
  (this_00->super_ShortRangeInteraction).localIndex_ = iVar4;
  OpenMD_itoa_abi_cxx11_
            (&s,(OpenMD *)
                ((ulong)((long)(mol->bends_).
                               super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(mol->bends_).
                              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3),10,uVar5);
  Molecule::getType_abi_cxx11_(&local_110,mol);
  std::operator+(&local_138,&local_110,"_Bend_");
  std::operator+(&local_158,&local_138,s._M_dataplus._M_p);
  (*(this_00->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(this_00,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&s);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bendAtoms.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>_>
               *)&btParser);
  return this_00;
}

Assistant:

Bend* MoleculeCreator::createBend(ForceField* ff, Molecule* mol,
                                    BendStamp* stamp,
                                    LocalIndexManager* localIndexMan) {
    BendTypeParser btParser;
    BendType* bendType = NULL;
    Bend* bend         = NULL;

    std::vector<int> bendAtoms = stamp->getMembers();
    if (bendAtoms.size() == 3) {
      Atom* atomA = mol->getAtomAt(bendAtoms[0]);
      Atom* atomB = mol->getAtomAt(bendAtoms[1]);
      Atom* atomC = mol->getAtomAt(bendAtoms[2]);

      assert(atomA && atomB && atomC);

      if (stamp->hasOverride()) {
        try {
          bendType = btParser.parseTypeAndPars(stamp->getOverrideType(),
                                               stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        bendType =
            ff->getBendType(atomA->getType().c_str(), atomB->getType().c_str(),
                            atomC->getType().c_str());

        if (bendType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Bend Type for[%s, %s, %s]",
                   atomA->getType().c_str(), atomB->getType().c_str(),
                   atomC->getType().c_str());

          painCave.isFatal = 1;
          simError();
        }
      }

      bend = new Bend(atomA, atomB, atomC, bendType);

    } else if (bendAtoms.size() == 2 && stamp->haveGhostVectorSource()) {
      int ghostIndex = stamp->getGhostVectorSource();
      int normalIndex =
          ghostIndex != bendAtoms[0] ? bendAtoms[0] : bendAtoms[1];
      Atom* normalAtom = mol->getAtomAt(normalIndex);
      DirectionalAtom* ghostAtom =
          dynamic_cast<DirectionalAtom*>(mol->getAtomAt(ghostIndex));
      if (ghostAtom == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not cast Atom to DirectionalAtom");
        painCave.isFatal = 1;
        simError();
      }

      if (stamp->hasOverride()) {
        try {
          bendType = btParser.parseTypeAndPars(stamp->getOverrideType(),
                                               stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        bendType = ff->getBendType(normalAtom->getType(), ghostAtom->getType(),
                                   "GHOST");

        if (bendType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Bend Type for[%s, %s, %s]",
                   normalAtom->getType().c_str(), ghostAtom->getType().c_str(),
                   "GHOST");

          painCave.isFatal = 1;
          simError();
        }
      }

      bend = new GhostBend(normalAtom, ghostAtom, bendType);
    }

    // set the local index of this bend, the global index will be set later
    bend->setLocalIndex(localIndexMan->getNextBendIndex());

    // The rule for naming a bend is: MoleculeName_Bend_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "Bend"
    // The third part is the index of the bend defined in meta-data file
    // For example, Butane_Bend_0 is a valid Bend name in a butane molecule

    std::string s = OpenMD_itoa(mol->getNBends(), 10);
    bend->setName(mol->getType() + "_Bend_" + s.c_str());
    return bend;
  }